

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O1

void __thiscall
Mustache::Renderer::readSetDelimiter(Renderer *this,QString *content,int pos,int endPos)

{
  char16_t cVar1;
  char16_t *pcVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  wchar32 wVar6;
  long lVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QString endMarker;
  QString startMarker;
  QString local_a8;
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QArrayData *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  
  local_68 = (QArrayData *)0x0;
  uStack_60 = 0;
  local_58 = 0;
  local_78 = 0;
  local_88 = (QArrayData *)0x0;
  uStack_80 = 0;
  pcVar2 = (content->d).ptr;
  lVar4 = (long)endPos;
  lVar5 = (long)pos;
  do {
    lVar7 = lVar5;
    cVar1 = pcVar2[lVar7];
    if ((0x17 < (ushort)((ushort)cVar1 - 9)) ||
       (cVar3 = '\x01', (0x80001fU >> ((ushort)cVar1 - 9 & 0x1f) & 1) == 0)) {
      if ((ushort)cVar1 < 0x80) {
        cVar3 = '\0';
      }
      else {
        cVar3 = '\x01';
        if ((cVar1 != L'\x85') && ((uint)(ushort)cVar1 != L'\xa0')) {
          cVar3 = QChar::isSpace_helper((uint)(ushort)cVar1);
        }
      }
    }
  } while ((lVar7 < lVar4) && (lVar5 = lVar7 + 1, cVar3 != '\0'));
  while( true ) {
    pcVar2 = (content->d).ptr;
    cVar1 = pcVar2[lVar7];
    wVar6 = (wchar32)(ushort)cVar1;
    if ((0x17 < (ushort)((ushort)cVar1 - 9)) ||
       (cVar3 = '\x01', (0x80001fU >> ((ushort)cVar1 - 9 & 0x1f) & 1) == 0)) {
      if ((ushort)cVar1 < 0x80) {
        cVar3 = '\0';
      }
      else {
        cVar3 = '\x01';
        if ((cVar1 != L'\x85') && (wVar6 != L'\xa0')) {
          cVar3 = QChar::isSpace_helper(wVar6);
        }
      }
    }
    if ((lVar4 <= lVar7) || (cVar3 != '\0')) goto LAB_00118112;
    if (wVar6 == L'=') break;
    QString::append((QChar)(char16_t)&local_68);
    lVar7 = lVar7 + 1;
  }
  QVar8.m_data = (storage_type *)0x26;
  QVar8.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar8);
  local_a8.d.d = (Data *)local_48;
  local_a8.d.ptr = pcStack_40;
  local_a8.d.size = local_38;
  setError(this,&local_a8,(int)lVar7);
  goto LAB_00118271;
LAB_00118112:
  do {
    lVar5 = lVar7;
    cVar1 = pcVar2[lVar5];
    if ((0x17 < (ushort)((ushort)cVar1 - 9)) ||
       (cVar3 = '\x01', (0x80001fU >> ((ushort)cVar1 - 9 & 0x1f) & 1) == 0)) {
      if ((ushort)cVar1 < 0x80) {
        cVar3 = '\0';
      }
      else {
        cVar3 = '\x01';
        if ((cVar1 != L'\x85') && ((uint)(ushort)cVar1 != L'\xa0')) {
          cVar3 = QChar::isSpace_helper((uint)(ushort)cVar1);
        }
      }
    }
  } while ((lVar5 < lVar4) && (lVar7 = lVar5 + 1, cVar3 != '\0'));
  while( true ) {
    cVar1 = (content->d).ptr[lVar5];
    wVar6 = (wchar32)(ushort)cVar1;
    if ((0x17 < (ushort)((ushort)cVar1 - 9)) ||
       (cVar3 = '\x01', (0x80001fU >> ((ushort)cVar1 - 9 & 0x1f) & 1) == 0)) {
      if ((ushort)cVar1 < 0x80) {
        cVar3 = '\0';
      }
      else {
        cVar3 = '\x01';
        if ((cVar1 != L'\x85') && (wVar6 != L'\xa0')) {
          cVar3 = QChar::isSpace_helper(wVar6);
        }
      }
    }
    if ((cVar3 != '\0') || (endPos + -1 <= lVar5)) {
      QString::operator=(&this->m_tagStartMarker,(QString *)&local_68);
      QString::operator=(&this->m_tagEndMarker,(QString *)&local_88);
      goto LAB_00118294;
    }
    if (wVar6 == L'=') break;
    QString::append((QChar)(char16_t)&local_88);
    lVar5 = lVar5 + 1;
  }
  QVar9.m_data = (storage_type *)0x26;
  QVar9.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar9);
  local_a8.d.d = (Data *)local_48;
  local_a8.d.ptr = pcStack_40;
  local_a8.d.size = local_38;
  setError(this,&local_a8,(int)lVar5);
LAB_00118271:
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
LAB_00118294:
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  return;
}

Assistant:

void Renderer::readSetDelimiter(const QString& content, int pos, int endPos)
{
	QString startMarker;
	QString endMarker;

	while (content.at(pos).isSpace() && pos < endPos) {
		++pos;
	}

	while (!content.at(pos).isSpace() && pos < endPos) {
		if (content.at(pos) == '=') {
			setError("Custom delimiters may not contain '='.", pos);
			return;
		}
		startMarker += content.at(pos);
		++pos;
	}

	while (content.at(pos).isSpace() && pos < endPos) {
		++pos;
	}

	while (!content.at(pos).isSpace() && pos < endPos - 1) {
		if (content.at(pos) == '=') {
			setError("Custom delimiters may not contain '='.", pos);
			return;
		}
		endMarker += content.at(pos);
		++pos;
	}

	m_tagStartMarker = startMarker;
	m_tagEndMarker = endMarker;
}